

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrEyeGazesFB *value,string *prefix,
               string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  XrStructureType XVar3;
  pointer pcVar4;
  PFN_xrStructureTypeToString p_Var5;
  void *value_00;
  XrStructureType __val;
  uint uVar6;
  bool bVar7;
  char *pcVar8;
  XrInstance pXVar9;
  invalid_argument *piVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong __val_00;
  XrGeneratedDispatchTable *gen_dispatch_table_00;
  XrEyeGazeFB *value_01;
  uint uVar15;
  string type_prefix;
  string time_prefix;
  string __str_1;
  string gaze_prefix;
  string next_prefix;
  ostringstream oss_gaze_array;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  *local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long *local_238;
  long local_230;
  long local_228 [2];
  string *local_218;
  XrEyeGazesFB *local_210;
  undefined1 local_208 [16];
  PFN_xrEnumerateInstanceExtensionProperties local_1f8;
  string local_1e8;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  PFN_xrGetReferenceSpaceBoundsRect local_188;
  PFN_xrCreateActionSpace p_Stack_180;
  PFN_xrLocateSpace local_178;
  PFN_xrDestroySpace p_Stack_170;
  ios_base local_138 [264];
  
  paVar1 = &local_1a8.field_2;
  local_2c0._M_dataplus._M_p = (pointer)value;
  local_2a0 = (vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
               *)contents;
  local_1a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_1a8,'\x12');
  *local_1a8._M_dataplus._M_p = '0';
  local_1a8._M_dataplus._M_p[1] = 'x';
  pcVar8 = local_1a8._M_dataplus._M_p + local_1a8._M_string_length + -1;
  lVar12 = 0;
  do {
    bVar2 = *(byte *)((long)&local_2c0._M_dataplus._M_p + lVar12);
    *pcVar8 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
    pcVar8[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
    lVar12 = lVar12 + 1;
    pcVar8 = pcVar8 + -2;
  } while (lVar12 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            (local_2a0,type_string,prefix,&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c0,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_2c0);
  local_218 = prefix;
  local_210 = value;
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar3 = value->type;
    __val = -XVar3;
    if (0 < (int)XVar3) {
      __val = XVar3;
    }
    uVar15 = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar14 = (ulong)__val;
      uVar6 = 4;
      do {
        uVar15 = uVar6;
        uVar11 = (uint)uVar14;
        if (uVar11 < 100) {
          uVar15 = uVar15 - 2;
          goto LAB_001c9f4d;
        }
        if (uVar11 < 1000) {
          uVar15 = uVar15 - 1;
          goto LAB_001c9f4d;
        }
        if (uVar11 < 10000) goto LAB_001c9f4d;
        uVar14 = uVar14 / 10000;
        uVar6 = uVar15 + 4;
      } while (99999 < uVar11);
      uVar15 = uVar15 + 1;
    }
LAB_001c9f4d:
    local_1a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_1a8,(char)uVar15 - (char)((int)XVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_1a8._M_dataplus._M_p + (XVar3 >> 0x1f),uVar15,__val);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              (local_2a0,(char (*) [16])"XrStructureType",&local_2c0,&local_1a8);
    value = local_210;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_178 = (PFN_xrLocateSpace)0x0;
    p_Stack_170 = (PFN_xrDestroySpace)0x0;
    local_188 = (PFN_xrGetReferenceSpaceBoundsRect)0x0;
    p_Stack_180 = (PFN_xrCreateActionSpace)0x0;
    local_1a8.field_2._M_allocated_capacity = 0;
    local_1a8.field_2._8_8_ = 0;
    local_1a8._M_dataplus._M_p = (pointer)0x0;
    local_1a8._M_string_length = 0;
    p_Var5 = gen_dispatch_table->StructureTypeToString;
    pXVar9 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var5)(pXVar9,value->type,(char *)&local_1a8);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              (local_2a0,(char (*) [16])"XrStructureType",&local_2c0,(char (*) [64])&local_1a8);
  }
  local_238 = local_228;
  pcVar4 = (local_218->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,pcVar4,pcVar4 + local_218->_M_string_length);
  std::__cxx11::string::append((char *)&local_238);
  value_00 = value->next;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_238,local_230 + (long)local_238);
  bVar7 = ApiDumpDecodeNextChain
                    (gen_dispatch_table,value_00,&local_1c8,
                     (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (!bVar7) {
    piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar10,"Invalid Operation");
    __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  pcVar4 = (local_218->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,pcVar4,pcVar4 + local_218->_M_string_length);
  std::__cxx11::string::append((char *)&local_258);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  *(uint *)((long)&local_1a8.field_2 + *(long *)(local_1a8._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_1a8.field_2 + *(long *)(local_1a8._M_dataplus._M_p + -0x18) + 8) &
       0xffffffb5 | 8;
  value_01 = value->gaze;
  std::ostream::_M_insert<void_const*>(&local_1a8);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[13],std::__cxx11::string&,std::__cxx11::string>
            (local_2a0,(char (*) [13])"XrEyeGazeFB*",&local_258,&local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  lVar12 = 0;
  do {
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_298,local_258._M_dataplus._M_p,
               local_258._M_dataplus._M_p + local_258._M_string_length);
    std::__cxx11::string::append((char *)&local_298);
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_278,'\x01');
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_278._M_dataplus._M_p,(uint)local_278._M_string_length,(uint)lVar12);
    std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_278._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_298);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_208 + 0x20),local_298._M_dataplus._M_p,
               local_298._M_dataplus._M_p + local_298._M_string_length);
    local_208._0_8_ = local_208 + 0x10;
    gen_dispatch_table_00 = (XrGeneratedDispatchTable *)local_208;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"XrEyeGazeFB","");
    bVar7 = ApiDumpOutputXrStruct
                      (gen_dispatch_table_00,value_01,(string *)(local_208 + 0x20),
                       (string *)local_208,false,
                       (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_2a0);
    if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
      operator_delete((void *)local_208._0_8_,(ulong)(local_1f8 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,
                      (ulong)(local_1e8.field_2._M_allocated_capacity + 1));
    }
    if (!bVar7) {
      piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar10,"Invalid Operation");
      __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    lVar12 = lVar12 + 1;
    value_01 = value_01 + 1;
  } while (lVar12 == 1);
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  pcVar4 = (local_218->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,pcVar4,pcVar4 + local_218->_M_string_length);
  std::__cxx11::string::append((char *)&local_298);
  uVar14 = local_210->time;
  __val_00 = -uVar14;
  if (0 < (long)uVar14) {
    __val_00 = uVar14;
  }
  uVar15 = 1;
  if (9 < __val_00) {
    uVar13 = __val_00;
    uVar6 = 4;
    do {
      uVar15 = uVar6;
      if (uVar13 < 100) {
        uVar15 = uVar15 - 2;
        goto LAB_001ca367;
      }
      if (uVar13 < 1000) {
        uVar15 = uVar15 - 1;
        goto LAB_001ca367;
      }
      if (uVar13 < 10000) goto LAB_001ca367;
      bVar7 = 99999 < uVar13;
      uVar13 = uVar13 / 10000;
      uVar6 = uVar15 + 4;
    } while (bVar7);
    uVar15 = uVar15 + 1;
  }
LAB_001ca367:
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_278,(char)uVar15 - (char)((long)uVar14 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_278._M_dataplus._M_p + -((long)uVar14 >> 0x3f),uVar15,__val_00);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string>
            (local_2a0,(char (*) [7])"XrTime",&local_298,&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if (local_238 != local_228) {
    operator_delete(local_238,local_228[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrEyeGazesFB* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string gaze_prefix = prefix;
        gaze_prefix += "gaze";
        std::ostringstream oss_gaze_array;
        oss_gaze_array << std::hex << reinterpret_cast<const void*>(value->gaze);
        contents.emplace_back("XrEyeGazeFB*", gaze_prefix, oss_gaze_array.str());
        for (uint32_t value_gaze_inc = 0; value_gaze_inc < XR_EYE_POSITION_COUNT_FB; ++value_gaze_inc) {
            std::string gaze_array_prefix = gaze_prefix;
            gaze_array_prefix += "[";
            gaze_array_prefix += std::to_string(value_gaze_inc);
            gaze_array_prefix += "]";
            if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->gaze[value_gaze_inc], gaze_array_prefix, "XrEyeGazeFB", false, contents)) {
                throw std::invalid_argument("Invalid Operation");
            }
        }
        std::string time_prefix = prefix;
        time_prefix += "time";
        contents.emplace_back("XrTime", time_prefix, std::to_string(value->time));
        return true;
    } catch(...) {
    }
    return false;
}